

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

void __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::HashMap(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
          *this,size_type capacity)

{
  size_t *psVar1;
  size_type sVar2;
  bool bVar3;
  WorldTeam *this_00;
  Team *pTVar4;
  size_t sVar5;
  size_t sVar6;
  reference pvVar7;
  runtime_error *this_01;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *pHVar8;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  GVar9;
  size_type local_60;
  size_type rank;
  size_type i;
  HME *local_table;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  local_38 [2];
  size_type local_18;
  size_type capacity_local;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *this_local;
  
  this->capacity_ = capacity;
  local_18 = capacity;
  capacity_local = (size_type)this;
  this_00 = (WorldTeam *)operator_new(8);
  *this_00 = (WorldTeam)0x0;
  WorldTeam::WorldTeam(this_00);
  std::unique_ptr<BCL::Team,std::default_delete<BCL::Team>>::
  unique_ptr<std::default_delete<BCL::Team>,void>
            ((unique_ptr<BCL::Team,std::default_delete<BCL::Team>> *)&this->team_ptr_,
             (pointer)this_00);
  std::
  vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ::vector(&this->hash_table_);
  sVar2 = this->capacity_;
  pTVar4 = team(this);
  sVar5 = nprocs(pTVar4);
  pTVar4 = team(this);
  sVar6 = nprocs(pTVar4);
  this->local_capacity_ = ((sVar2 - 1) + sVar5) / sVar6;
  pTVar4 = team(this);
  sVar5 = nprocs(pTVar4);
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  ::GlobalPtr(local_38,(nullptr_t)0x0);
  std::
  vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ::resize(&this->hash_table_,sVar5,local_38);
  GVar9 = alloc<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
                    (this->local_capacity_);
  pTVar4 = team(this);
  sVar5 = BCL::rank(pTVar4);
  pvVar7 = std::
           vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
           ::operator[](&this->hash_table_,sVar5);
  pvVar7->rank = GVar9.rank;
  pvVar7->ptr = GVar9.ptr;
  pTVar4 = team(this);
  sVar5 = BCL::rank(pTVar4);
  pvVar7 = std::
           vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
           ::operator[](&this->hash_table_,sVar5);
  bVar3 = GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
          ::operator==(pvVar7,(nullptr_t)0x0);
  if (!bVar3) {
    pTVar4 = team(this);
    sVar5 = BCL::rank(pTVar4);
    pvVar7 = std::
             vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
             ::operator[](&this->hash_table_,sVar5);
    pHVar8 = GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
             ::local(pvVar7);
    for (rank = 0; rank < this->local_capacity_; rank = rank + 1) {
      psVar1 = &pHVar8[rank].key.len;
      *psVar1 = 0;
      psVar1[1] = 0;
      pHVar8[rank].key.ptr.rank = 0;
      pHVar8[rank].key.ptr.ptr = 0;
      HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::HashMapEntry(pHVar8 + rank);
    }
    local_60 = 0;
    while( true ) {
      pTVar4 = team(this);
      sVar5 = nprocs(pTVar4);
      if (sVar5 <= local_60) break;
      pvVar7 = std::
               vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
               ::operator[](&this->hash_table_,local_60);
      GVar9 = broadcast<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>>
                        (pvVar7,local_60);
      pvVar7 = std::
               vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
               ::operator[](&this->hash_table_,local_60);
      pvVar7->rank = GVar9.rank;
      pvVar7->ptr = GVar9.ptr;
      local_60 = local_60 + 1;
    }
    barrier();
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"BCL::HashMap: ran out of memory\n");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

HashMap(size_type capacity) : capacity_(capacity), team_ptr_(new BCL::WorldTeam()) {
    local_capacity_ = (capacity_ + BCL::nprocs(team()) - 1) / BCL::nprocs(team());
    hash_table_.resize(BCL::nprocs(team()), nullptr);

    hash_table_[BCL::rank(team())] = BCL::alloc <HME> (local_capacity_);

    if (hash_table_[BCL::rank(team())] == nullptr) {
      throw std::runtime_error("BCL::HashMap: ran out of memory\n");
    }

    HME* local_table = hash_table_[BCL::rank(team())].local();
    for (size_type i = 0; i < local_capacity_; i++) {
        new (&local_table[i]) HME();
    }

    for (size_type rank = 0; rank < BCL::nprocs(team()); rank++) {
      hash_table_[rank] = BCL::broadcast(hash_table_[rank], rank);
    }
    BCL::barrier();
  }